

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O1

string * __thiscall
vkt::synchronization::getResourceName_abi_cxx11_
          (string *__return_storage_ptr__,synchronization *this,ResourceDescription *resource)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  char *__s;
  long *plVar5;
  ostringstream str;
  allocator<char> local_3e1;
  long *local_3e0;
  long local_3d8;
  long local_3d0;
  long lStack_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  string local_3a0;
  string local_380;
  long *local_360 [2];
  long local_350 [2];
  long *local_340 [2];
  long local_330 [2];
  long *local_320;
  long local_318;
  long local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar1 = *(int *)this;
  if (iVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"image_",6);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a8,*(int *)(this + 4));
    iVar1 = *(int *)(this + 8);
    if (iVar1 < 1) {
      local_3c0 = &local_3b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      std::ostream::operator<<(&local_320,iVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
      std::ios_base::~ios_base(local_2b0);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0xb26a0d);
      local_3c0 = &local_3b0;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_3b0 = *plVar5;
        lStack_3a8 = plVar4[3];
      }
      else {
        local_3b0 = *plVar5;
        local_3c0 = (long *)*plVar4;
      }
      local_3b8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_3c0,local_3b8);
    iVar2 = *(int *)(this + 0xc);
    if (iVar2 < 1) {
      local_3e0 = &local_3d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"");
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      std::ostream::operator<<(&local_320,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
      std::ios_base::~ios_base(local_2b0);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_360,0,(char *)0x0,0xb26a0d);
      local_3e0 = &local_3d0;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_3d0 = *plVar5;
        lStack_3c8 = plVar4[3];
      }
      else {
        local_3d0 = *plVar5;
        local_3e0 = (long *)*plVar4;
      }
      local_3d8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_3e0,local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
    __s = ::vk::getFormatName(*(VkFormat *)(this + 0x18));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,__s,&local_3e1);
    de::toLower(&local_380,&local_3a0);
    std::__cxx11::string::substr((ulong)&local_320,(ulong)&local_380);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_320,local_318);
    if (local_320 != local_310) {
      operator_delete(local_320,local_310[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0,local_3d0 + 1);
    }
    if ((0 < iVar2) && (local_360[0] != local_350)) {
      operator_delete(local_360[0],local_350[0] + 1);
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,local_3b0 + 1);
    }
    if ((0 < iVar1) && (local_340[0] != local_330)) {
      operator_delete(local_340[0],local_330[0] + 1);
    }
  }
  else if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"buffer_",7);
    std::ostream::operator<<(local_1a8,*(int *)(this + 4));
  }
  else if (iVar1 - 2U < 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"indirect_buffer",0xf);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getResourceName (const ResourceDescription& resource)
{
	std::ostringstream str;

	if (resource.type == RESOURCE_TYPE_BUFFER)
		str << "buffer_" << resource.size.x();
	else if (resource.type == RESOURCE_TYPE_IMAGE)
	{
		str << "image_" << resource.size.x()
						<< (resource.size.y() > 0 ? "x" + de::toString(resource.size.y()) : "")
						<< (resource.size.z() > 0 ? "x" + de::toString(resource.size.z()) : "")
			<< "_" << de::toLower(getFormatName(resource.imageFormat)).substr(10);
	}
	else if (isIndirectBuffer(resource.type))
		str << "indirect_buffer";
	else
		DE_ASSERT(0);

	return str.str();
}